

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

void __thiscall QWidgetLineControl::emitCursorPositionChanged(QWidgetLineControl *this)

{
  int _t2;
  int _t1;
  long in_FS_OFFSET;
  code *local_30;
  undefined8 local_28;
  long local_20;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  _t2 = *(int *)(this + 0x40);
  _t1 = *(int *)(this + 100);
  if (_t2 != _t1) {
    *(int *)(this + 100) = _t2;
    cursorPositionChanged(this,_t1,_t2);
    if ((*(long *)(this + 0x28) == 0) || (*(int *)(this + 0x114) <= *(int *)(this + 0x110))) {
      local_20 = *(long *)(this + 0x130);
      if (local_20 == 0) {
        local_20 = *(long *)(*(long *)(this + 8) + 0x10);
      }
      local_14 = *(undefined4 *)(this + 0x40);
      local_18 = 0xffffffff;
      local_30 = QTextCursor::isNull;
      local_28 = 0xaaaaaaaa0000011b;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_30);
      QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent
                ((QAccessibleTextCursorEvent *)&local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::emitCursorPositionChanged()
{
    if (m_cursor != m_lastCursorPos) {
        const int oldLast = m_lastCursorPos;
        m_lastCursorPos = m_cursor;
        emit cursorPositionChanged(oldLast, m_cursor);
#if QT_CONFIG(accessibility)
        // otherwise we send a selection update which includes the cursor
        if (!hasSelectedText()) {
            QAccessibleTextCursorEvent event(accessibleObject(), m_cursor);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }
}